

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint *puVar4;
  ImGuiWindow *tooltip_window;
  ImGuiPayload *payload;
  ImGuiID IStack_2c;
  bool is_hovered;
  ImGuiMouseButton mouse_button;
  ImGuiID source_parent_id;
  ImGuiID source_id;
  bool source_drag_active;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiDragDropFlags flags_local;
  
  pIVar2 = GImGui;
  _source_id = GImGui->CurrentWindow;
  IStack_2c = 0;
  if ((flags & 0x10U) == 0) {
    mouse_button = (_source_id->DC).LastItemId;
    if ((mouse_button != 0) && (GImGui->ActiveId != mouse_button)) {
      return false;
    }
    if (((GImGui->IO).MouseDown[0] & 1U) == 0) {
      return false;
    }
    if (mouse_button == 0) {
      if ((flags & 8U) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x278c,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      if ((((_source_id->DC).LastItemStatusFlags & 1U) == 0) &&
         ((GImGui->ActiveId == 0 || (GImGui->ActiveIdWindow != _source_id)))) {
        return false;
      }
      mouse_button = ImGuiWindow::GetIDFromRectangle(_source_id,&(_source_id->DC).LastItemRect);
      (_source_id->DC).LastItemId = mouse_button;
      bVar3 = ItemHoverable(&(_source_id->DC).LastItemRect,mouse_button);
      if ((bVar3) && (((pIVar2->IO).MouseClicked[0] & 1U) != 0)) {
        SetActiveID(mouse_button,_source_id);
        FocusWindow(_source_id);
      }
      if (pIVar2->ActiveId == mouse_button) {
        pIVar2->ActiveIdAllowOverlap = bVar3;
      }
    }
    else {
      GImGui->ActiveIdAllowOverlap = false;
    }
    if (pIVar2->ActiveId != mouse_button) {
      return false;
    }
    puVar4 = ImVector<unsigned_int>::back(&_source_id->IDStack);
    IStack_2c = *puVar4;
    source_parent_id._3_1_ = IsMouseDragging(0,-1.0);
    pIVar2->ActiveIdUsingNavDirMask = 0xffffffff;
    pIVar2->ActiveIdUsingNavInputMask = 0xffffffff;
    pIVar2->ActiveIdUsingKeyInputMask = 0xffffffffffffffff;
  }
  else {
    _source_id = (ImGuiWindow *)0x0;
    mouse_button = ImHashStr("#SourceExtern",0,0);
    source_parent_id._3_1_ = true;
  }
  if (source_parent_id._3_1_ == false) {
    g._7_1_ = false;
  }
  else {
    if ((pIVar2->DragDropActive & 1U) == 0) {
      if (mouse_button == 0) {
        __assert_fail("source_id != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x27bb,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      ClearDragDrop();
      (pIVar2->DragDropPayload).SourceId = mouse_button;
      (pIVar2->DragDropPayload).SourceParentId = IStack_2c;
      pIVar2->DragDropActive = true;
      pIVar2->DragDropSourceFlags = flags;
      pIVar2->DragDropMouseButton = 0;
    }
    pIVar2->DragDropSourceFrameCount = pIVar2->FrameCount;
    pIVar2->DragDropWithinSource = true;
    if ((((flags & 1U) == 0) && (BeginTooltip(), pIVar2->DragDropAcceptIdPrev != 0)) &&
       ((pIVar2->DragDropAcceptFlags & 0x1000U) != 0)) {
      pIVar1 = pIVar2->CurrentWindow;
      pIVar1->SkipItems = true;
      pIVar1->HiddenFramesCanSkipItems = 1;
    }
    if (((flags & 2U) == 0) && ((flags & 0x10U) == 0)) {
      (_source_id->DC).LastItemStatusFlags = (_source_id->DC).LastItemStatusFlags & 0xfffffffe;
    }
    g._7_1_ = true;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = window->DC.LastItemId;
        if (source_id != 0 && g.ActiveId != source_id) // Early out for most common case
            return false;
        if (g.IO.MouseDown[mouse_button] == false)
            return false;

        if (source_id == 0)
        {
            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag, C) Swallow your programmer pride.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Early out
            if ((window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // Magic fallback (=somehow reprehensible) to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            source_id = window->DC.LastItemId = window->GetIDFromRectangle(window->DC.LastItemRect);
            bool is_hovered = ItemHoverable(window->DC.LastItemRect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        else
        {
            g.ActiveIdAllowOverlap = false;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging
        g.ActiveIdUsingNavDirMask = ~(ImU32)0;
        g.ActiveIdUsingNavInputMask = ~(ImU32)0;
        g.ActiveIdUsingKeyInputMask = ~(ImU64)0;
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            window->DC.LastItemStatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}